

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver.hpp
# Opt level: O0

void progress_bar(int current_frame_index,int total_frames)

{
  ostream *poVar1;
  allocator<char> local_69;
  string local_68 [8];
  string clearln;
  allocator<char> local_31;
  string local_30 [8];
  string mvleft;
  int total_frames_local;
  int current_frame_index_local;
  
  mvleft.field_2._8_4_ = total_frames;
  mvleft.field_2._12_4_ = current_frame_index;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"\x1b[1000D",&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,"\x1b[2K",&local_69);
  std::allocator<char>::~allocator(&local_69);
  poVar1 = std::operator<<((ostream *)&std::cout,local_30);
  std::operator<<(poVar1,local_68);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)color::yellow_abi_cxx11_);
  poVar1 = std::operator<<(poVar1," Processing: ");
  poVar1 = std::operator<<(poVar1,(string *)color::green_abi_cxx11_);
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,((mvleft.field_2._12_4_ + 1) / (int)mvleft.field_2._8_4_) * 100);
  poVar1 = std::operator<<(poVar1,"%");
  std::operator<<(poVar1,(string *)color::reset_abi_cxx11_);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void progress_bar(int current_frame_index, int total_frames)
{
    std::string const mvleft = "\033[1000D";
    std::string const clearln = "\033[2K";
    std::cout << mvleft << clearln;
    std::cout << color::yellow << " Processing: " << color::green << ((current_frame_index + 1) / total_frames) * 100 << "%" << color::reset;
}